

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O3

adt_error_t adt_ary_push_unique(adt_ary_t *self,void *pElem)

{
  int iVar1;
  adt_error_t aVar2;
  long lVar3;
  
  if (self == (adt_ary_t *)0x0) {
    return '\x01';
  }
  if (0 < (long)self->s32CurLen) {
    lVar3 = 0;
    do {
      if (self->pFirst[lVar3] == pElem) {
        return '\0';
      }
      lVar3 = lVar3 + 1;
    } while (self->s32CurLen != lVar3);
  }
  if (self == (adt_ary_t *)0x0) {
    aVar2 = '\x01';
  }
  else {
    iVar1 = self->s32CurLen;
    if ((long)iVar1 == 0x7fffffff) {
      __assert_fail("self->s32CurLen < INT32_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_ary.c"
                    ,0xaa,"adt_error_t adt_ary_push(adt_ary_t *, void *)");
    }
    aVar2 = adt_ary_extend(self,iVar1 + 1);
    if (aVar2 == '\0') {
      self->pFirst[iVar1] = pElem;
      aVar2 = '\0';
    }
  }
  return aVar2;
}

Assistant:

adt_error_t adt_ary_push_unique(adt_ary_t *self, void *pElem){
   if (self != 0)
   {
      int32_t s32Index;
      for(s32Index = 0; s32Index < self->s32CurLen; s32Index++ )
      {
         if (self->pFirst[s32Index] == pElem){
            return ADT_NO_ERROR;
         }
      }
      return adt_ary_push(self, pElem);
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}